

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStreamComponent_GetAvailableFrames
                  (PaAlsaStreamComponent *self,unsigned_long *numFrames,int *xrunOccurred)

{
  int iVar1;
  ulong uVar2;
  pthread_t __thread1;
  char *errorText;
  
  uVar2 = snd_pcm_avail_update(self->pcm);
  *xrunOccurred = 0;
  if (uVar2 == 0xffffffffffffffe0) {
    *xrunOccurred = 1;
    uVar2 = 0;
  }
  else if ((int)uVar2 < 0) {
    __thread1 = pthread_self();
    iVar1 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar1 != 0) {
      errorText = (char *)snd_strerror(uVar2 & 0xffffffff);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)(int)uVar2,errorText);
    }
    PaUtil_DebugPrint(
                     "Expression \'framesAvail\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3620\n"
                     );
    return -9999;
  }
  *numFrames = uVar2;
  return 0;
}

Assistant:

static PaError PaAlsaStreamComponent_GetAvailableFrames( PaAlsaStreamComponent *self, unsigned long *numFrames, int *xrunOccurred )
{
    PaError result = paNoError;
    snd_pcm_sframes_t framesAvail = alsa_snd_pcm_avail_update( self->pcm );
    *xrunOccurred = 0;

    if( -EPIPE == framesAvail )
    {
        *xrunOccurred = 1;
        framesAvail = 0;
    }
    else
    {
        ENSURE_( framesAvail, paUnanticipatedHostError );
    }

    *numFrames = framesAvail;

error:
    return result;
}